

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coherent_memory_read.cpp
# Opt level: O2

GLuint init_ssbo(void)

{
  void *__s;
  GLuint data;
  
  (*glad_glGenBuffers)(1,&data);
  (*glad_glBindBufferBase)(0x90d2,0,data);
  (*glad_glBufferStorage)(0x90d2,180000,(void *)0x0,0xc3);
  __s = (*glad_glMapBufferRange)(0x90d2,0,180000,0xc3);
  memset(__s,0x55,180000);
  (*glad_glUnmapBuffer)(0x90d2);
  check_error();
  return data;
}

Assistant:

static GLuint init_ssbo(void)
{
    GLuint data;

    glGenBuffers(1, &data);
    glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, data);

    glBufferStorage(GL_SHADER_STORAGE_BUFFER, values_count * 4, nullptr,
        GL_MAP_READ_BIT |
        GL_MAP_WRITE_BIT |
        GL_MAP_PERSISTENT_BIT |
        GL_MAP_COHERENT_BIT);

    int* coherent_memory = reinterpret_cast<int*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0,
        values_count * 4, GL_MAP_READ_BIT |
        GL_MAP_WRITE_BIT |
        GL_MAP_PERSISTENT_BIT |
        GL_MAP_COHERENT_BIT));

    memset(coherent_memory, fill_value_a, values_count * 4);
    glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

    check_error();

    return data;
}